

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8collationiterator.cpp
# Opt level: O3

UBool __thiscall icu_63::FCDUTF8CollationIterator::nextHasLccc(FCDUTF8CollationIterator *this)

{
  uint uVar1;
  uint8_t *puVar2;
  ulong uVar3;
  uint uVar4;
  byte bVar5;
  uint uVar6;
  long lVar8;
  ulong uVar9;
  ulong uVar7;
  
  puVar2 = (this->super_UTF8CollationIterator).u8;
  lVar8 = (long)(this->super_UTF8CollationIterator).pos;
  bVar5 = puVar2[lVar8];
  if (bVar5 < 0xcc) {
    return '\0';
  }
  if (bVar5 != 0xea && (byte)(bVar5 + 0x1c) < 10) {
    return '\0';
  }
  uVar7 = lVar8 + 1;
  uVar1 = (this->super_UTF8CollationIterator).length;
  uVar3 = 0xfffd;
  if ((uint)uVar7 == uVar1) goto LAB_0022052c;
  uVar4 = (uint)bVar5;
  if (bVar5 < 0xe0) {
    uVar4 = uVar4 & 0x1f;
  }
  else {
    if (bVar5 < 0xf0) {
      uVar4 = uVar4 & 0xf;
      if (((byte)" 000000000000\x1000"[uVar4] >> (puVar2[uVar7] >> 5) & 1) == 0) goto LAB_0022052c;
      bVar5 = puVar2[uVar7] & 0x3f;
    }
    else {
      if (0xf4 < bVar5) goto LAB_0022052c;
      if (((((uint)(int)""[puVar2[uVar7] >> 4] >> (uVar4 - 0xf0 & 0x1f) & 1) == 0) ||
          (uVar9 = lVar8 + 2, (uint)uVar9 == uVar1)) || (bVar5 = puVar2[uVar9] + 0x80, 0x3f < bVar5)
         ) goto LAB_0022052c;
      uVar4 = puVar2[uVar7] & 0x3f | (uVar4 - 0xf0) * 0x40;
      uVar7 = uVar9 & 0xffffffff;
    }
    uVar6 = (int)uVar7 + 1;
    uVar7 = (ulong)uVar6;
    if (uVar6 == uVar1) goto LAB_0022052c;
    uVar4 = (uint)bVar5 | uVar4 << 6;
  }
  if ((byte)(puVar2[(int)uVar7] ^ 0x80) < 0x40) {
    uVar1 = (uVar4 >> 4) + 0xd7c0 & 0xffff;
    if (uVar4 < 0x400) {
      uVar1 = uVar4 << 6 | puVar2[(int)uVar7] ^ 0x80;
    }
    uVar3 = (ulong)uVar1;
    if (uVar1 < 0x300) {
      return '\0';
    }
  }
LAB_0022052c:
  if ((ulong)(byte)CollationFCD::lcccIndex[uVar3 >> 5] == 0) {
    return '\0';
  }
  return (*(uint *)(CollationFCD::lcccBits + (ulong)(byte)CollationFCD::lcccIndex[uVar3 >> 5] * 4)
          >> ((uint)uVar3 & 0x1f) & 1) != 0;
}

Assistant:

UBool
FCDUTF8CollationIterator::nextHasLccc() const {
    U_ASSERT(state == CHECK_FWD && pos != length);
    // The lowest code point with ccc!=0 is U+0300 which is CC 80 in UTF-8.
    // CJK U+4000..U+DFFF except U+Axxx are also FCD-inert. (Lead bytes E4..ED except EA.)
    UChar32 c = u8[pos];
    if(c < 0xcc || (0xe4 <= c && c <= 0xed && c != 0xea)) { return FALSE; }
    int32_t i = pos;
    U8_NEXT_OR_FFFD(u8, i, length, c);
    if(c > 0xffff) { c = U16_LEAD(c); }
    return CollationFCD::hasLccc(c);
}